

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

int wrap_qpdfjob(qpdfjob_handle j,function<int_(_qpdfjob_handle_*)> *fn)

{
  int iVar1;
  exception *e;
  function<int_(_qpdfjob_handle_*)> *fn_local;
  qpdfjob_handle j_local;
  
  iVar1 = std::function<int_(_qpdfjob_handle_*)>::operator()(fn,j);
  return iVar1;
}

Assistant:

static int
wrap_qpdfjob(qpdfjob_handle j, std::function<int(qpdfjob_handle j)> fn)
{
    try {
        return fn(j);
    } catch (std::exception& e) {
        *j->j.getLogger()->getError() << j->j.getMessagePrefix() << ": " << e.what() << "\n";
    }
    return QPDFJob::EXIT_ERROR;
}